

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

void ZSTD_initCCtx(ZSTD_CCtx *cctx,ZSTD_customMem memManager)

{
  ZSTD_cpuid_t ZVar1;
  
  memset(cctx,0,0x3d8);
  (cctx->customMem).customAlloc = memManager.customAlloc;
  (cctx->customMem).customFree = memManager.customFree;
  (cctx->customMem).opaque = memManager.opaque;
  ZVar1 = ZSTD_cpuid();
  cctx->bmi2 = ZVar1.f1c >> 8 & 1;
  (cctx->requestedParams).fParams.contentSizeFlag = 0;
  (cctx->requestedParams).fParams.checksumFlag = 0;
  *(undefined8 *)&(cctx->requestedParams).fParams.noDictIDFlag = 0;
  (cctx->requestedParams).format = ZSTD_f_zstd1;
  (cctx->requestedParams).cParams.windowLog = 0;
  (cctx->requestedParams).cParams.chainLog = 0;
  (cctx->requestedParams).cParams.hashLog = 0;
  (cctx->requestedParams).cParams.searchLog = 0;
  (cctx->requestedParams).cParams.minMatch = 0;
  (cctx->requestedParams).cParams.targetLength = 0;
  (cctx->requestedParams).cParams.strategy = 0;
  (cctx->requestedParams).forceWindow = 0;
  (cctx->requestedParams).attachDictPref = ZSTD_dictDefaultAttach;
  *(undefined8 *)&(cctx->requestedParams).nbWorkers = 0;
  (cctx->requestedParams).jobSize = 0;
  (cctx->requestedParams).overlapLog = 0;
  (cctx->requestedParams).rsyncable = 0;
  (cctx->requestedParams).ldmParams.enableLdm = 0;
  (cctx->requestedParams).ldmParams.hashLog = 0;
  (cctx->requestedParams).ldmParams.bucketSizeLog = 0;
  (cctx->requestedParams).ldmParams.minMatchLength = 0;
  (cctx->requestedParams).ldmParams.hashRateLog = 0;
  (cctx->requestedParams).ldmParams.windowLog = 0;
  (cctx->requestedParams).customMem.customAlloc = (ZSTD_allocFunction)0x0;
  (cctx->requestedParams).customMem.customFree = (ZSTD_freeFunction)0x0;
  (cctx->requestedParams).customMem.opaque = (void *)0x0;
  (cctx->requestedParams).compressionLevel = 3;
  (cctx->requestedParams).fParams.contentSizeFlag = 1;
  return;
}

Assistant:

static void ZSTD_initCCtx(ZSTD_CCtx* cctx, ZSTD_customMem memManager)
{
    assert(cctx != NULL);
    memset(cctx, 0, sizeof(*cctx));
    cctx->customMem = memManager;
    cctx->bmi2 = ZSTD_cpuid_bmi2(ZSTD_cpuid());
    {   size_t const err = ZSTD_CCtx_reset(cctx, ZSTD_reset_parameters);
        assert(!ZSTD_isError(err));
        (void)err;
    }
}